

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

value * __thiscall cppcms::json::value::operator[](value *this,string *name)

{
  bool bVar1;
  json_type jVar2;
  undefined8 uVar3;
  object *__rhs;
  const_iterator this_00;
  pointer ppVar4;
  json_type in_stack_000000b0;
  json_type in_stack_000000b4;
  string *in_stack_000000b8;
  const_iterator p;
  object *self;
  map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
  *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  _Self local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  _Self local_58;
  object *local_50;
  undefined1 local_45;
  allocator local_31;
  string local_30 [48];
  
  jVar2 = type((value *)0x3e4759);
  if (jVar2 != is_object) {
    local_45 = 1;
    uVar3 = __cxa_allocate_exception(0x48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"",&local_31);
    type((value *)0x3e47b0);
    bad_value_cast::bad_value_cast
              ((bad_value_cast *)p._M_node,in_stack_000000b8,in_stack_000000b4,in_stack_000000b0);
    local_45 = 0;
    __cxa_throw(uVar3,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
  }
  __rhs = object((value *)0x3e4861);
  __lhs = &local_88;
  local_50 = __rhs;
  string_key::unowned((string *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  this_00 = std::
            map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
            ::find(in_stack_fffffffffffffee8,(key_type *)0x3e489f);
  local_58._M_node = this_00._M_node;
  string_key::~string_key((string_key *)0x3e48c0);
  local_90._M_node =
       (_Base_ptr)
       std::
       map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
       ::end(in_stack_fffffffffffffee8);
  bVar1 = std::operator==(&local_58,&local_90);
  if (!bVar1) {
    ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>
                           *)0x3e4a05);
    return &ppVar4->second;
  }
  uVar3 = __cxa_allocate_exception(0x48);
  std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::operator+(__lhs,(char *)__rhs);
  bad_value_cast::bad_value_cast((bad_value_cast *)this_00._M_node,__lhs);
  __cxa_throw(uVar3,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
}

Assistant:

value const &value::operator[](std::string const &name) const
	{
		if(type()!=json::is_object)
			throw bad_value_cast("",type(),json::is_object);
		json::object const &self=object();
		json::object::const_iterator p=self.find(string_key::unowned(name));
		if(p==self.end())
			throw bad_value_cast("Member "+name+" not found");
		return p->second;
	}